

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

string * __thiscall
higan::FileForRead::ReadLine_abi_cxx11_(string *__return_storage_ptr__,FileForRead *this)

{
  ssize_t sVar1;
  allocator<char> local_19;
  
  sVar1 = ReadFileToBuffer(this,&this->cache_buffer_);
  if (sVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
  }
  else {
    Buffer::ReadLine_abi_cxx11_(__return_storage_ptr__,&this->cache_buffer_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileForRead::ReadLine()
{
	if (ReadFileToBuffer(&cache_buffer_) == -1)
	{
		return "";
	}

	return cache_buffer_.ReadLine();
}